

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O0

void gba_rtc_write(gpio_port_t value,uint8_t mask)

{
  gbabus_t *pgVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  rtc_t *prVar5;
  byte in_SIL;
  byte in_DIL;
  uint8_t bit_1;
  uint8_t bit;
  rtc_t *rtc;
  
  pgVar1 = bus;
  prVar5 = &bus->rtc;
  if (1 < gba_log_verbosity) {
    printf("\x1b[0;36m[INFO]  state: %d SCK: %d SIO: %d CS: %d\n\x1b[0;m",(ulong)prVar5->state,
           (ulong)(in_DIL & 1),(ulong)(in_DIL >> 1 & 1),(ulong)(in_DIL >> 2 & 1));
  }
  switch(prVar5->state) {
  case RTC_READY:
    (pgVar1->rtc).command_buffer = '\0';
    (pgVar1->rtc).current_command_bit = 0;
    if (((in_DIL >> 2 & 1) != 0) || ((in_DIL & 1) != 1)) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
              0x8a);
      fprintf(_stderr,"Unhandled CS: %d SCK: %d combination in READY state\n\x1b[0;m",
              (ulong)(in_DIL >> 2 & 1),(ulong)(in_DIL & 1));
      exit(1);
    }
    prVar5->state = RTC_COMMAND_MODE_1;
    break;
  case RTC_COMMAND_MODE_1:
    if (((in_DIL >> 2 & 1) == 1) && ((in_DIL & 1) == 1)) {
      prVar5->state = RTC_COMMAND_MODE_2;
    }
    else {
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_1 state\n\x1b[0;m"
               ,(ulong)(in_DIL >> 2 & 1),(ulong)(in_DIL & 1));
      }
      prVar5->state = RTC_COMMAND_MODE_1;
    }
    break;
  case RTC_COMMAND_MODE_2:
    if (((in_DIL >> 2 & 1) == 1) && ((in_DIL & 1) == 0)) {
      bVar2 = in_DIL >> 1 & 1;
      (pgVar1->rtc).command_buffer =
           (pgVar1->rtc).command_buffer &
           (bVar2 << ((byte)(pgVar1->rtc).current_command_bit & 0x1f) ^ 0xff);
      (pgVar1->rtc).command_buffer =
           (pgVar1->rtc).command_buffer | bVar2 << ((byte)(pgVar1->rtc).current_command_bit & 0x1f);
    }
    else {
      if (((in_DIL >> 2 & 1) != 1) || ((in_DIL & 1) != 1)) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c"
                ,0xaa);
        fprintf(_stderr,
                "Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_2 state (command 0x%02X)\n\x1b[0;m"
                ,(ulong)(in_DIL >> 2 & 1),(ulong)(in_DIL & 1),(ulong)(pgVar1->rtc).command_buffer);
        exit(1);
      }
      bVar2 = in_DIL >> 1 & 1;
      (pgVar1->rtc).command_buffer =
           (pgVar1->rtc).command_buffer &
           (bVar2 << ((byte)(pgVar1->rtc).current_command_bit & 0x1f) ^ 0xff);
      (pgVar1->rtc).command_buffer =
           (pgVar1->rtc).command_buffer | bVar2 << ((byte)(pgVar1->rtc).current_command_bit & 0x1f);
      iVar4 = (pgVar1->rtc).current_command_bit + 1;
      (pgVar1->rtc).current_command_bit = iVar4;
      if (iVar4 == 8) {
        if ((int)(uint)(pgVar1->rtc).command_buffer >> 4 == 6) {
          uVar3 = reverse((pgVar1->rtc).command_buffer);
          (pgVar1->rtc).command_buffer = uVar3;
          if (2 < gba_log_verbosity) {
            printf("[DEBUG] [GPIO] [RTC] Need to reverse the command.\n");
          }
        }
        else if ((((pgVar1->rtc).command_buffer & 0xf) == 6) && (2 < gba_log_verbosity)) {
          printf("[DEBUG] [GPIO] [RTC] Already got the command in a good order.\n");
        }
        run_command('\0');
      }
    }
    break;
  case RTC_DATA_READ:
    if (((in_DIL >> 2 & 1) == 1) && ((in_DIL & 1) == 1)) {
      if (((bus->port).raw & 1) == 0) {
        (bus->port).raw = (bus->port).raw & 0xfd | (((pgVar1->rtc).buffer & 1) != 0) << 1;
        (pgVar1->rtc).buffer = (pgVar1->rtc).buffer >> 1;
      }
    }
    else if (((in_DIL >> 2 & 1) != 1) || ((in_DIL & 1) != 0)) {
      if ((in_DIL >> 2 & 1) != 0) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c"
                ,0xb9);
        fprintf(_stderr,"Unhandled CS: %d SCK: %d combination in RTC_DATA_READ\n\x1b[0;m",
                (ulong)(in_DIL >> 2 & 1),(ulong)(in_DIL & 1));
        exit(1);
      }
      prVar5->state = RTC_READY;
    }
    break;
  case RTC_DATA_WRITE:
    if (((in_DIL >> 2 & 1) == 0) && ((in_DIL & 1) == 1)) {
      uVar3 = (pgVar1->rtc).reg;
      if (uVar3 == '\0') {
        printf("RESET\n");
        (pgVar1->rtc).buffer = 0;
        (pgVar1->rtc).control_reg.raw = '\0';
      }
      else {
        if (uVar3 != '\x04') {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c"
                  ,0xc9);
          fprintf(_stderr,"Wrote to unknown register: %d\n\x1b[0;m",(ulong)(pgVar1->rtc).reg);
          exit(1);
        }
        uVar3 = reverse((uint8_t)(pgVar1->rtc).buffer);
        (pgVar1->rtc).control_reg.raw = uVar3;
        printf("Control reg is now: 0x%02X\n",(ulong)(pgVar1->rtc).control_reg.raw);
      }
      prVar5->state = RTC_READY;
    }
    else if (((in_DIL >> 2 & 1) == 1) && ((in_DIL & 1) == 1)) {
      (pgVar1->rtc).buffer = (pgVar1->rtc).buffer << 1;
      (pgVar1->rtc).buffer = (pgVar1->rtc).write_mask & (pgVar1->rtc).buffer;
    }
    else {
      if (((in_DIL >> 2 & 1) != 1) || ((in_DIL & 1) != 0)) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c"
                ,0xd4);
        fprintf(_stderr,"Unhandled CS: %d SCK: %d combination in RTC_DATA_WRITE\n\x1b[0;m",
                (ulong)(in_DIL >> 2 & 1),(ulong)(in_DIL & 1));
        exit(1);
      }
      (pgVar1->rtc).buffer = (pgVar1->rtc).buffer & 0xfffffffffffffffe;
      (pgVar1->rtc).buffer = (long)(int)(uint)(in_DIL >> 1 & 1) | (pgVar1->rtc).buffer;
      printf("RTC write buffer: 0x%lX\n",(pgVar1->rtc).buffer);
    }
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
            0xd8);
    fprintf(_stderr,"Write to GPIO while in unknown state: %d\n\x1b[0;m",(ulong)prVar5->state);
    exit(1);
  }
  (bus->port).raw = (bus->port).raw & (in_SIL ^ 0xff);
  (bus->port).raw = (bus->port).raw | in_DIL;
  return;
}

Assistant:

void gba_rtc_write(gpio_port_t value, byte mask) {
    rtc_t* rtc = &bus->rtc;
    loginfo("state: %d SCK: %d SIO: %d CS: %d", rtc->state, value.rtc_sck, value.rtc_sio, value.rtc_cs);

    switch (rtc->state) {
        case RTC_READY:
            rtc->command_buffer = 0;
            rtc->current_command_bit = 0;
            if (value.rtc_cs == 0 && value.rtc_sck == 1) {
                rtc->state = RTC_COMMAND_MODE_1;
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in READY state", value.rtc_cs, value.rtc_sck)
            }
            break;
        case RTC_COMMAND_MODE_1:
            if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                rtc->state = RTC_COMMAND_MODE_2;
            } else {
                logwarn("Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_1 state", value.rtc_cs, value.rtc_sck)
                rtc->state = RTC_COMMAND_MODE_1;
            }
            break;
        case RTC_COMMAND_MODE_2:
            if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                byte bit = value.rtc_sio & 1;
                rtc->command_buffer &= ~(bit << rtc->current_command_bit);
                rtc->command_buffer |= (bit << rtc->current_command_bit);
            } else if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                byte bit = value.rtc_sio & 1;
                rtc->command_buffer &= ~(bit << rtc->current_command_bit);
                rtc->command_buffer |= (bit << rtc->current_command_bit);
                if (++rtc->current_command_bit == 8) {
                    if ((rtc->command_buffer >> 4) == 6) {
                        rtc->command_buffer = reverse(rtc->command_buffer);
                        logdebug("[GPIO] [RTC] Need to reverse the command.");
                    } else if ((rtc->command_buffer & 0xF) == 6) {
                        logdebug("[GPIO] [RTC] Already got the command in a good order.");
                    }
                    // Command passed validity check and is now in the correct order. Command is in the upper 4 bits,
                    // Lower 4 are always a 6.
                    run_command((rtc->command_buffer >> 4) & 0xF);
                }
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_2 state (command 0x%02X)", value.rtc_cs, value.rtc_sck, rtc->command_buffer)
            }
            break;
        case RTC_DATA_READ:
            if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                // If the value here used to be 0, send the next data bit
                if (bus->port.rtc_sck == 0) {
                    bus->port.rtc_sio = rtc->buffer & 1;
                    rtc->buffer >>= 1;
                }
            } else if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                // Ignore
            } else if (value.rtc_cs == 0) {
                rtc->state = RTC_READY;
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_DATA_READ", value.rtc_cs, value.rtc_sck)
            }
            break;
        case RTC_DATA_WRITE:
            if (value.rtc_cs == 0 && value.rtc_sck == 1) {
                switch (rtc->reg) {
                    case RESET_REG:
                        printf("RESET\n");
                        rtc->buffer = 0;
                        rtc->control_reg.raw = 0;
                        break;
                    case CONTROL_REG:
                        rtc->control_reg.raw = reverse(rtc->buffer & 0xFF);
                        printf("Control reg is now: 0x%02X\n", rtc->control_reg.raw);
                        break;
                    default:
                        logfatal("Wrote to unknown register: %d", rtc->reg)
                }
                rtc->state = RTC_READY;
            } else if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                rtc->buffer <<= 1;
                rtc->buffer &= rtc->write_mask;
            } else if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                rtc->buffer &= 0xFFFFFFFFFFFFFFFE;
                rtc->buffer |= (value.rtc_sio & 1);
                printf("RTC write buffer: 0x%lX\n", rtc->buffer);
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_DATA_WRITE", value.rtc_cs, value.rtc_sck)
            }
            break;
        default:
            logfatal("Write to GPIO while in unknown state: %d", rtc->state)
    }

    bus->port.raw &= ~mask;
    bus->port.raw |= value.raw;
}